

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatWriter.cpp
# Opt level: O2

void __thiscall OpenMD::StatWriter::writePotVec(StatWriter *this,int i)

{
  uint j;
  long lVar1;
  bool bVar2;
  uint j_1;
  potVec s;
  potVec local_78;
  string local_40;
  
  Stats::getPotVecData(&local_78,this->stats_,i);
  bVar2 = false;
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    bVar2 = (bool)(bVar2 | 0x7fefffffffffffff < (ulong)ABS(local_78.data_[lVar1]));
  }
  if (bVar2) {
    Stats::getTitle_abi_cxx11_(&local_40,this->stats_,i);
    snprintf(painCave.errMsg,2000,"StatWriter detected a numerical error writing: %s",
             local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    painCave.isFatal = 1;
    simError();
  }
  else {
    for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
      std::operator<<((ostream *)this,"\t");
      std::ostream::_M_insert<double>(local_78.data_[lVar1]);
    }
  }
  return;
}

Assistant:

void StatWriter::writePotVec(int i) {
    potVec s = stats_->getPotVecData(i);

    bool foundError = false;

    for (unsigned int j = 0; j < N_INTERACTION_FAMILIES; j++) {
      if (std::isinf(s[j]) || std::isnan(s[j])) foundError = true;
    }
    if (foundError) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "StatWriter detected a numerical error writing: %s",
               stats_->getTitle(i).c_str());
      painCave.isFatal = 1;
      simError();
    } else {
      for (unsigned int j = 0; j < N_INTERACTION_FAMILIES; j++) {
        statfile_ << "\t" << s[j];
      }
    }
  }